

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardwarex.cpp
# Opt level: O0

int RecvDataMDMx(MDM *pMDM,uchar *buf,int buflen,int *pReceivedBytes)

{
  int iVar1;
  int *pReceivedBytes_local;
  int buflen_local;
  uchar *buf_local;
  MDM *pMDM_local;
  
  iVar1 = RecvDataMDM(pMDM,buf,buflen,pReceivedBytes);
  return iVar1;
}

Assistant:

HARDWAREX_API int RecvDataMDMx(MDM* pMDM, unsigned char* buf, int buflen, int* pReceivedBytes)
{
	return RecvDataMDM(pMDM, buf, buflen, pReceivedBytes);
}